

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall
cmCTest::HandleTestActionArgument
          (cmCTest *this,char *ctestExec,size_t *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  const_reference pvVar4;
  size_type sVar5;
  pointer pPVar6;
  ostream *poVar7;
  char *pcVar8;
  char *in_R8;
  static_string_view sVar9;
  string_view varg1;
  string local_398 [32];
  ostringstream local_378 [8];
  ostringstream cmCTestLog_msg_1;
  string local_200 [48];
  ostringstream local_1d0 [8];
  ostringstream cmCTestLog_msg;
  string *local_58;
  char *local_50;
  string *arg;
  bool success;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  size_t *i_local;
  char *ctestExec_local;
  cmCTest *this_local;
  
  arg._7_1_ = true;
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,*i);
  sVar9 = ::cm::operator____s("-T",2);
  local_58 = (string *)sVar9.super_string_view._M_len;
  local_50 = sVar9.super_string_view._M_str;
  varg1._M_str = "--test-action";
  varg1._M_len = (size_t)local_50;
  bVar2 = CheckArgument((cmCTest *)pvVar4,local_58,varg1,in_R8);
  bVar3 = false;
  if (bVar2) {
    uVar1 = *i;
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    bVar3 = uVar1 < sVar5 - 1;
  }
  if (bVar3) {
    pPVar6 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    pPVar6->ProduceXML = true;
    *i = *i + 1;
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,*i);
    bVar3 = SetTest(this,pvVar4,false);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream(local_1d0);
      poVar7 = std::operator<<((ostream *)local_1d0,"CTest -T called with incorrect option: ");
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,*i);
      poVar7 = std::operator<<(poVar7,(string *)pvVar4);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      Log(this,7,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0xaff,pcVar8,false);
      std::__cxx11::string::~string(local_200);
      std::__cxx11::ostringstream::~ostringstream(local_1d0);
      std::__cxx11::ostringstream::ostringstream(local_378);
      poVar7 = std::operator<<((ostream *)local_378,"Available options are:");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,"  ");
      poVar7 = std::operator<<(poVar7,ctestExec);
      poVar7 = std::operator<<(poVar7," -T all");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,"  ");
      poVar7 = std::operator<<(poVar7,ctestExec);
      poVar7 = std::operator<<(poVar7," -T start");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,"  ");
      poVar7 = std::operator<<(poVar7,ctestExec);
      poVar7 = std::operator<<(poVar7," -T update");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,"  ");
      poVar7 = std::operator<<(poVar7,ctestExec);
      poVar7 = std::operator<<(poVar7," -T configure");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,"  ");
      poVar7 = std::operator<<(poVar7,ctestExec);
      poVar7 = std::operator<<(poVar7," -T build");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,"  ");
      poVar7 = std::operator<<(poVar7,ctestExec);
      poVar7 = std::operator<<(poVar7," -T test");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,"  ");
      poVar7 = std::operator<<(poVar7,ctestExec);
      poVar7 = std::operator<<(poVar7," -T coverage");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,"  ");
      poVar7 = std::operator<<(poVar7,ctestExec);
      poVar7 = std::operator<<(poVar7," -T memcheck");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,"  ");
      poVar7 = std::operator<<(poVar7,ctestExec);
      poVar7 = std::operator<<(poVar7," -T notes");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      poVar7 = std::operator<<(poVar7,"  ");
      poVar7 = std::operator<<(poVar7,ctestExec);
      poVar7 = std::operator<<(poVar7," -T submit");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      Log(this,7,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0xb0c,pcVar8,false);
      std::__cxx11::string::~string(local_398);
      std::__cxx11::ostringstream::~ostringstream(local_378);
    }
    arg._7_1_ = bVar3;
  }
  return arg._7_1_;
}

Assistant:

bool cmCTest::HandleTestActionArgument(const char* ctestExec, size_t& i,
                                       const std::vector<std::string>& args)
{
  bool success = true;
  std::string const& arg = args[i];
  if (this->CheckArgument(arg, "-T"_s, "--test-action") &&
      (i < args.size() - 1)) {
    this->Impl->ProduceXML = true;
    i++;
    if (!this->SetTest(args[i], false)) {
      success = false;
      cmCTestLog(this, ERROR_MESSAGE,
                 "CTest -T called with incorrect option: " << args[i]
                                                           << std::endl);
      cmCTestLog(this, ERROR_MESSAGE,
                 "Available options are:"
                   << std::endl
                   << "  " << ctestExec << " -T all" << std::endl
                   << "  " << ctestExec << " -T start" << std::endl
                   << "  " << ctestExec << " -T update" << std::endl
                   << "  " << ctestExec << " -T configure" << std::endl
                   << "  " << ctestExec << " -T build" << std::endl
                   << "  " << ctestExec << " -T test" << std::endl
                   << "  " << ctestExec << " -T coverage" << std::endl
                   << "  " << ctestExec << " -T memcheck" << std::endl
                   << "  " << ctestExec << " -T notes" << std::endl
                   << "  " << ctestExec << " -T submit" << std::endl);
    }
  }
  return success;
}